

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O2

void FindLinks(lemon *lemp)

{
  state *psVar1;
  plink *ppVar2;
  int iVar3;
  long lVar4;
  config *pcVar5;
  config **ppcVar6;
  plink **pppVar7;
  
  iVar3 = lemp->nstate;
  lVar4 = 0;
  while( true ) {
    if (iVar3 <= lVar4) {
      lVar4 = 0;
      while( true ) {
        if (iVar3 <= lVar4) {
          return;
        }
        if (lemp->sorted[lVar4] == (state *)0x0) break;
        ppcVar6 = &lemp->sorted[lVar4]->cfp;
        while( true ) {
          pcVar5 = *ppcVar6;
LAB_001036ab:
          if (pcVar5 == (config *)0x0) break;
          pppVar7 = &pcVar5->bplp;
          while (ppVar2 = *pppVar7, ppVar2 != (plink *)0x0) {
            Plink_add(&ppVar2->cfp->fplp,pcVar5);
            pppVar7 = &ppVar2->next;
          }
          ppcVar6 = &pcVar5->next;
        }
        lVar4 = lVar4 + 1;
        iVar3 = lemp->nstate;
      }
      pcVar5 = (config *)0x0;
      goto LAB_001036ab;
    }
    psVar1 = lemp->sorted[lVar4];
    if (psVar1 == (state *)0x0) break;
    ppcVar6 = &psVar1->cfp;
    while( true ) {
      pcVar5 = *ppcVar6;
LAB_00103675:
      if (pcVar5 == (config *)0x0) break;
      pcVar5->stp = psVar1;
      ppcVar6 = &pcVar5->next;
    }
    lVar4 = lVar4 + 1;
  }
  pcVar5 = (config *)0x0;
  goto LAB_00103675;
}

Assistant:

void FindLinks(struct lemon *lemp)
{
  int i;
  struct config *cfp, *other;
  struct state *stp;
  struct plink *plp;

  /* Housekeeping detail:
  ** Add to every propagate link a pointer back to the state to
  ** which the link is attached. */
  for(i=0; i<lemp->nstate; i++){
    stp = lemp->sorted[i];
    for(cfp=stp?stp->cfp:0; cfp; cfp=cfp->next){
      cfp->stp = stp;
    }
  }

  /* Convert all backlinks into forward links.  Only the forward
  ** links are used in the follow-set computation. */
  for(i=0; i<lemp->nstate; i++){
    stp = lemp->sorted[i];
    for(cfp=stp?stp->cfp:0; cfp; cfp=cfp->next){
      for(plp=cfp->bplp; plp; plp=plp->next){
        other = plp->cfp;
        Plink_add(&other->fplp,cfp);
      }
    }
  }
}